

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O1

Node * rengine::Node::create(void)

{
  Node *pNVar1;
  
  if (__allocation_pool_rengine_Node.m_nextFree < __allocation_pool_rengine_Node.m_poolSize) {
    pNVar1 = AllocationPool<rengine::Node>::allocate(&__allocation_pool_rengine_Node);
    pNVar1->field_0x31 = pNVar1->field_0x31 | 2;
  }
  else {
    pNVar1 = (Node *)operator_new(0x38);
    (pNVar1->super_SignalEmitter).m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    (pNVar1->super_SignalEmitter)._vptr_SignalEmitter = (_func_int **)&PTR__Node_00138960;
    pNVar1->m_parent = (Node *)0x0;
    pNVar1->m_child = (Node *)0x0;
    pNVar1->m_next = (Node *)0x0;
    pNVar1->m_prev = (Node *)0x0;
    *(uint *)&pNVar1->field_0x30 = *(uint *)&pNVar1->field_0x30 & 0xfffff800;
  }
  return pNVar1;
}

Assistant:

void __mark_as_pool_allocated() { m_poolAllocated = true; }